

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_init_cnt(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,gost_subst_block *block)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *__src;
  void *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  ossl_gost_cipher_ctx *c;
  gost_subst_block *in_stack_ffffffffffffffb8;
  gost_ctx *in_stack_ffffffffffffffc0;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  gost_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined4 *)(lVar2 + 8) = 1;
  *(undefined4 *)(lVar2 + 4) = 0;
  if (in_RSI != 0) {
    gost_key(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8->k8);
  }
  if (in_RDX != (void *)0x0) {
    pvVar3 = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
    memcpy(pvVar3,in_RDX,(long)iVar1);
  }
  pvVar3 = (void *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  __src = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
  memcpy(pvVar3,__src,(long)iVar1);
  return 1;
}

Assistant:

static int gost_cipher_init_cnt(EVP_CIPHER_CTX *ctx,
                                const unsigned char *key,
                                const unsigned char *iv,
                                gost_subst_block * block)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_init(&(c->cctx), block);
    c->key_meshing = 1;
    c->count = 0;
    if (key)
        gost_key(&(c->cctx), key);
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));
    return 1;
}